

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O1

void __thiscall
MeshDenoisingViaL0Minimization::calculateAreaBasedEdgeOperator
          (MeshDenoisingViaL0Minimization *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *area_based_edge_operator,
          vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
          *edge_vertex_handle,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *coef)

{
  HalfedgeHandle _heh;
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  pointer pVVar6;
  HalfedgeHandle _heh_00;
  PropertyContainer *this_00;
  value_handle vVar7;
  bool bVar8;
  int iVar9;
  size_type sVar10;
  Halfedge *pHVar11;
  PropertyT<OpenMesh::VectorT<double,_3>_> *pPVar12;
  reference pvVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  EdgeIter EVar19;
  undefined1 auStack_168 [8];
  vector<double,_std::allocator<double>_> face_area;
  undefined1 local_148 [16];
  double local_138;
  long local_128;
  double local_120;
  double local_118;
  double local_110;
  PropertyContainer *local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_c0;
  vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
  *local_b8;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  undefined1 local_98 [8];
  EdgeIter e_it;
  undefined1 auStack_78 [8];
  vector<double,_std::allocator<double>_> temp_coef;
  undefined1 auStack_58 [8];
  vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> vertex_handle;
  
  _auStack_168 = (undefined1  [16])0x0;
  face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c0 = coef;
  local_b8 = edge_vertex_handle;
  local_b0 = area_based_edge_operator;
  MeshDenoisingBase::getFaceArea
            (&this->super_MeshDenoisingBase,mesh,
             (vector<double,_std::allocator<double>_> *)auStack_168);
  iVar9 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x20))(mesh);
  local_148 = (undefined1  [16])0x0;
  local_138 = 0.0;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (local_b0,(long)iVar9,(value_type *)local_148);
  _auStack_78 = (undefined1  [16])0x0;
  temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])operator_new(0x20);
  temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((long)auStack_78 + 0x20);
  *(undefined1 (*) [16])((long)auStack_78 + 0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])auStack_78 = (undefined1  [16])0x0;
  temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = temp_coef.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  sVar10 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       + 0x20))(mesh);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_c0,sVar10,(value_type *)auStack_78);
  _auStack_58 = (undefined1  [16])0x0;
  vertex_handle.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])operator_new(0x10);
  vertex_handle.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)((long)auStack_58 + 0x10);
  *(undefined4 *)auStack_58 = 0xffffffff;
  *(undefined4 *)((long)auStack_58 + 4) = 0xffffffff;
  *(undefined4 *)((long)auStack_58 + 8) = 0xffffffff;
  *(undefined4 *)((long)auStack_58 + 0xc) = 0xffffffff;
  vertex_handle.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
  _M_impl.super__Vector_impl_data._M_start =
       vertex_handle.
       super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>._M_impl.
       super__Vector_impl_data._M_finish;
  sVar10 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       + 0x20))(mesh);
  std::
  vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
  ::resize(local_b8,sVar10,(value_type *)auStack_58);
  _local_98 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
  local_108 = (PropertyContainer *)
              &(mesh->super_Mesh).
               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               .
               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
               .field_0x8;
  while( true ) {
    EVar19 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
    if ((BaseHandle)e_it.mesh_._0_4_ == EVar19.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        local_98 == (undefined1  [8])EVar19.mesh_) break;
    bVar8 = OpenMesh::PolyConnectivity::is_boundary
                      ((PolyConnectivity *)mesh,(EdgeHandle)e_it.mesh_._0_4_);
    if (!bVar8) {
      lVar14 = (long)e_it.mesh_._0_4_;
      OpenMesh::
      PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      ::calc_edge_vector((Normal *)local_148,
                         (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          *)mesh,(HalfedgeHandle)(e_it.mesh_._0_4_ * 2));
      dVar15 = local_138 * local_138 +
               (double)local_148._0_8_ * (double)local_148._0_8_ +
               (double)local_148._8_8_ * (double)local_148._8_8_;
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      vVar7.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)e_it.mesh_._0_4_;
      _heh.super_BaseHandle.idx_ = (BaseHandle)(e_it.mesh_._0_4_ * 2 + 1);
      pHVar11 = OpenMesh::ArrayKernel::halfedge((ArrayKernel *)mesh,_heh);
      _heh_00.super_BaseHandle.idx_ = (BaseHandle)((int)vVar7.super_BaseHandle.idx_ * 2);
      iVar9 = (pHVar11->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
      pHVar11 = OpenMesh::ArrayKernel::halfedge((ArrayKernel *)mesh,_heh_00);
      local_a8 = (pHVar11->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
      pHVar11 = OpenMesh::ArrayKernel::halfedge((ArrayKernel *)mesh,_heh_00);
      pHVar11 = OpenMesh::ArrayKernel::halfedge
                          ((ArrayKernel *)mesh,
                           (HalfedgeHandle)
                           (pHVar11->super_Halfedge_without_prev).next_halfedge_handle_.
                           super_BaseHandle.idx_);
      local_a4 = (pHVar11->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
      pHVar11 = OpenMesh::ArrayKernel::halfedge((ArrayKernel *)mesh,_heh);
      local_128 = lVar14;
      pHVar11 = OpenMesh::ArrayKernel::halfedge
                          ((ArrayKernel *)mesh,
                           (HalfedgeHandle)
                           (pHVar11->super_Halfedge_without_prev).next_halfedge_handle_.
                           super_BaseHandle.idx_);
      iVar4 = (pHVar11->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
      pHVar11 = OpenMesh::ArrayKernel::halfedge((ArrayKernel *)mesh,_heh_00);
      iVar5 = (pHVar11->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
      pHVar11 = OpenMesh::ArrayKernel::halfedge((ArrayKernel *)mesh,_heh);
      this_00 = local_108;
      local_120 = *(double *)((long)auStack_168 + (long)iVar5 * 8);
      dVar1 = *(double *)
               ((long)auStack_168 +
               (long)(pHVar11->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ * 8);
      local_100 = local_120 + dVar1;
      pPVar12 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                          (local_108,
                           (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                           (mesh->super_Mesh).
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                           super_BaseHandle.idx_);
      local_a0 = iVar9;
      pvVar13 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](pPVar12,iVar9);
      local_e8 = (pvVar13->super_VectorDataT<double,_3>).values_[0];
      local_f8 = (pvVar13->super_VectorDataT<double,_3>).values_[1];
      e_it._8_8_ = (pvVar13->super_VectorDataT<double,_3>).values_[2];
      pPVar12 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                          (this_00,(BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                   (mesh->super_Mesh).
                                   super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                   .
                                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                   .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                                   super_BaseHandle.idx_);
      pvVar13 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](pPVar12,iVar4);
      dVar2 = (pvVar13->super_VectorDataT<double,_3>).values_[0];
      local_e0 = (pvVar13->super_VectorDataT<double,_3>).values_[1];
      local_f0 = (pvVar13->super_VectorDataT<double,_3>).values_[2];
      pPVar12 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                          (this_00,(BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                   (mesh->super_Mesh).
                                   super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                   .
                                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                   .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                                   super_BaseHandle.idx_);
      iVar9 = local_a8;
      local_9c = iVar4;
      pvVar13 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](pPVar12,local_a8);
      local_c8 = (pvVar13->super_VectorDataT<double,_3>).values_[0];
      local_d0 = (pvVar13->super_VectorDataT<double,_3>).values_[1];
      local_d8 = (pvVar13->super_VectorDataT<double,_3>).values_[2];
      pPVar12 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                          (this_00,(BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                   (mesh->super_Mesh).
                                   super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                   .
                                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                   .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                                   super_BaseHandle.idx_);
      iVar4 = local_a4;
      pvVar13 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](pPVar12,local_a4);
      lVar14 = local_128;
      local_118 = (pvVar13->super_VectorDataT<double,_3>).values_[0];
      dVar3 = (pvVar13->super_VectorDataT<double,_3>).values_[1];
      local_110 = (pvVar13->super_VectorDataT<double,_3>).values_[2];
      dVar18 = local_e8 - local_c8;
      dVar17 = local_f8 - local_d0;
      dVar16 = (double)e_it._8_8_ - local_d8;
      dVar15 = dVar15 * dVar15 * local_100;
      *(double *)auStack_78 =
           (((local_d8 - local_110) * dVar16 +
            (local_d0 - dVar3) * dVar17 + (local_c8 - local_118) * dVar18 + 0.0) * dVar1 -
           ((local_f0 - local_d8) * dVar16 +
           (local_e0 - local_d0) * dVar17 + (dVar2 - local_c8) * dVar18 + 0.0) * local_120) / dVar15
      ;
      *(double *)((long)auStack_78 + 8) = local_120 / local_100;
      *(double *)((long)auStack_78 + 0x10) =
           ((((double)e_it._8_8_ - local_110) * dVar16 +
            (local_f8 - dVar3) * dVar17 + (local_e8 - local_118) * dVar18 + 0.0) * -dVar1 -
           (dVar16 * ((double)e_it._8_8_ - local_f0) +
           dVar17 * (local_f8 - local_e0) + dVar18 * (local_e8 - dVar2) + 0.0) * local_120) / dVar15
      ;
      *(double *)((long)auStack_78 + 0x18) = dVar1 / local_100;
      std::vector<double,_std::allocator<double>_>::operator=
                ((local_c0->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + local_128,
                 (vector<double,_std::allocator<double>_> *)auStack_78);
      ((BaseHandle *)auStack_58)->idx_ = local_a0;
      (((pointer)((long)auStack_58 + 4))->super_BaseHandle).idx_ = local_9c;
      (((pointer)((long)auStack_58 + 8))->super_BaseHandle).idx_ = iVar9;
      (((pointer)((long)auStack_58 + 0xc))->super_BaseHandle).idx_ = iVar4;
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::operator=
                ((local_b8->
                 super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar14,
                 (vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                 auStack_58);
      dVar15 = *(double *)auStack_78;
      dVar1 = *(double *)((long)auStack_78 + 8);
      dVar16 = *(double *)((long)auStack_78 + 0x10);
      dVar17 = *(double *)((long)auStack_78 + 0x18);
      pVVar6 = (local_b0->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pVVar6[lVar14].super_VectorDataT<double,_3>.values_[0] =
           local_118 * dVar17 + local_c8 * dVar16 + dVar2 * dVar1 + local_e8 * dVar15;
      pVVar6[lVar14].super_VectorDataT<double,_3>.values_[1] =
           dVar3 * dVar17 + local_d0 * dVar16 + local_e0 * dVar1 + local_f8 * dVar15;
      pVVar6[lVar14].super_VectorDataT<double,_3>.values_[2] =
           local_110 * dVar17 + local_d8 * dVar16 + local_f0 * dVar1 + (double)e_it._8_8_ * dVar15;
    }
    e_it.mesh_._0_4_ = e_it.mesh_._0_4_ + 1;
    if (e_it.mesh_._4_4_ != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                  *)local_98);
    }
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58);
  }
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78);
  }
  if (auStack_168 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_168);
  }
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::calculateAreaBasedEdgeOperator(TriMesh &mesh,
                                                                    std::vector<TriMesh::Point> &area_based_edge_operator,
                                                                    std::vector< std::vector<TriMesh::VertexHandle> > &edge_vertex_handle,
                                                                    std::vector< std::vector<double> > &coef)
{
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);

    area_based_edge_operator.resize((int)mesh.n_edges(), TriMesh::Point(0.0, 0.0, 0.0));
    std::vector<double> temp_coef(4, 0.0);
    coef.resize(mesh.n_edges(), temp_coef);
    std::vector<TriMesh::VertexHandle> vertex_handle(4);
    edge_vertex_handle.resize(mesh.n_edges(), vertex_handle);
    for(TriMesh::EdgeIter e_it = mesh.edges_begin(); e_it != mesh.edges_end(); e_it++)
    {
        if(!mesh.is_boundary(*e_it))
        {
            int index = e_it->idx();
            double edge_length = mesh.calc_edge_length(*e_it);

            // get four vertices correspond to edge *e_it
            TriMesh::HalfedgeHandle he = mesh.halfedge_handle(*e_it, 0);
            TriMesh::VertexHandle v1 = mesh.from_vertex_handle(he);
            TriMesh::VertexHandle v3 = mesh.to_vertex_handle(he);
            TriMesh::HalfedgeHandle he_next = mesh.next_halfedge_handle(he);
            TriMesh::VertexHandle v4 = mesh.to_vertex_handle(he_next);

            TriMesh::HalfedgeHandle he_oppo = mesh.opposite_halfedge_handle(he);
            TriMesh::HalfedgeHandle he_oppo_next = mesh.next_halfedge_handle(he_oppo);
            TriMesh::VertexHandle v2 = mesh.to_vertex_handle(he_oppo_next);

            // two faces
            TriMesh::FaceHandle f1 = mesh.face_handle(he);
            TriMesh::FaceHandle f2 = mesh.face_handle(he_oppo);

            // the area of two faces correspond to edge *e_it
            double area134 = face_area[f1.idx()];
            double area123 = face_area[f2.idx()];
            double totalArea = area123 + area134;

            TriMesh::Point p1 = mesh.point(v1);
            TriMesh::Point p2 = mesh.point(v2);
            TriMesh::Point p3 = mesh.point(v3);
            TriMesh::Point p4 = mesh.point(v4);

            TriMesh::Point p12 = p1 - p2;
            TriMesh::Point p13 = p1 - p3;
            TriMesh::Point p14 = p1 - p4;
            TriMesh::Point p23 = p2 - p3;
            TriMesh::Point p34 = p3 - p4;

            // calc coefficient
            temp_coef[0] = (area123 * (p34 | p13) - area134 * (p13 | p23)) / (edge_length * edge_length * totalArea);
            temp_coef[1] = area134 / totalArea;
            temp_coef[2] = (-area123 * (p13 | p14) - area134 * (p12 | p13)) / (edge_length * edge_length * totalArea);
            temp_coef[3] = area123 / totalArea;
            coef[index] = temp_coef;

            vertex_handle[0] = v1;
            vertex_handle[1] = v2;
            vertex_handle[2] = v3;
            vertex_handle[3] = v4;
            edge_vertex_handle[index] = vertex_handle;

            // calc area-based edge operator
            TriMesh::Point pt = p1 * temp_coef[0] + p2 * temp_coef[1] + p3 * temp_coef[2] + p4 * temp_coef[3];
            area_based_edge_operator[index] = pt;
        }
    }
}